

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

void mp::
     WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<double,std::allocator<double>>,double>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               vector<double,_std::allocator<double>_> *v)

{
  double *pdVar1;
  int iVar2;
  double *el;
  double *pdVar3;
  bool bVar4;
  BasicStringRef<char> value;
  
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,'[');
  pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  iVar2 = 0;
  for (pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    bVar4 = iVar2 != 0;
    iVar2 = iVar2 + -1;
    if (bVar4) {
      value.size_ = 2;
      value.data_ = ", ";
      fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
    }
    fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,*pdVar3);
  }
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,']');
  return;
}

Assistant:

void WriteModelItemParameters(
    Writer& wrt, const Vec& v) {
  wrt << '[';
  int n=-1;
  for (const auto& el: v) {
    if (++n)
      wrt << ", ";
    wrt << el;
  }
  wrt << ']';
}